

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_nullddi.cpp
# Opt level: O3

ze_result_t
driver::zetMetricDecoderGetDecodableMetricsExp
          (zet_metric_decoder_exp_handle_t hMetricDecoder,uint32_t *pCount,
          zet_metric_handle_t *phMetrics)

{
  ze_result_t zVar1;
  ulong uVar2;
  
  if (DAT_0010e790 != (code *)0x0) {
    zVar1 = (*DAT_0010e790)();
    return zVar1;
  }
  if ((phMetrics != (zet_metric_handle_t *)0x0) && (*pCount != 0)) {
    uVar2 = 0;
    do {
      context_t::get()::count = context_t::get()::count + 1;
      phMetrics[uVar2] = context_t::get()::count;
      uVar2 = uVar2 + 1;
    } while (uVar2 < *pCount);
  }
  return ZE_RESULT_SUCCESS;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetMetricDecoderGetDecodableMetricsExp(
        zet_metric_decoder_exp_handle_t hMetricDecoder, ///< [in] handle of the metric decoder object
        uint32_t* pCount,                               ///< [in,out] pointer to number of decodable metric in the hMetricDecoder
                                                        ///< handle. If count is zero, then the driver shall 
                                                        ///< update the value with the total number of decodable metrics available
                                                        ///< in the decoder. if count is greater than zero 
                                                        ///< but less than the total number of decodable metrics available in the
                                                        ///< decoder, then only that number will be returned. 
                                                        ///< if count is greater than the number of decodable metrics available in
                                                        ///< the decoder, then the driver shall update the 
                                                        ///< value with the actual number of decodable metrics available. 
        zet_metric_handle_t* phMetrics                  ///< [in,out] [range(0, *pCount)] array of handles of decodable metrics in
                                                        ///< the hMetricDecoder handle provided.
        )
    {
        ze_result_t result = ZE_RESULT_SUCCESS;

        // if the driver has created a custom function, then call it instead of using the generic path
        auto pfnGetDecodableMetricsExp = context.zetDdiTable.MetricDecoderExp.pfnGetDecodableMetricsExp;
        if( nullptr != pfnGetDecodableMetricsExp )
        {
            result = pfnGetDecodableMetricsExp( hMetricDecoder, pCount, phMetrics );
        }
        else
        {
            // generic implementation
            for( size_t i = 0; ( nullptr != phMetrics ) && ( i < *pCount ); ++i )
                phMetrics[ i ] = reinterpret_cast<zet_metric_handle_t>( context.get() );

        }

        return result;
    }